

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_7::Validator::CheckMemoryVar(Validator *this,Var *var,Memory **out_memory)

{
  Result RVar1;
  Enum EVar2;
  uint local_1c [2];
  Index index;
  
  RVar1 = CheckVar(this,(Index)((ulong)((long)(this->current_module_->memories).
                                              super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(this->current_module_->memories).
                                             super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3),var,
                   "memory",local_1c);
  if (RVar1.enum_ == Error) {
    EVar2 = Error;
  }
  else {
    EVar2 = Ok;
    if (out_memory != (Memory **)0x0) {
      *out_memory = (this->current_module_->memories).
                    super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                    super__Vector_impl_data._M_start[local_1c[0]];
    }
  }
  return (Result)EVar2;
}

Assistant:

Result Validator::CheckMemoryVar(const Var* var, const Memory** out_memory) {
  Index index;
  CHECK_RESULT(
      CheckVar(current_module_->memories.size(), var, "memory", &index));
  if (out_memory) {
    *out_memory = current_module_->memories[index];
  }
  return Result::Ok;
}